

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int dohistory(void)

{
  nh_menuitem *pnVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  menulist menu;
  char buf [256];
  menulist local_150;
  uint local_13c;
  char local_138 [264];
  
  bVar2 = flags.debug;
  if (histcount < 2) {
    if ((char)program_state.gameover == '\0') {
      pline("History has not recorded anything about you.");
    }
  }
  else {
    local_13c = program_state.gameover;
    init_menulist(&local_150);
    if (histcount != 0) {
      uVar7 = local_13c & 0xff;
      lVar6 = 8;
      uVar8 = 0;
      uVar5 = local_13c;
      do {
        if (((*(int *)(histevents->what + lVar6 + -0xc) == 0) || (uVar7 != 0)) || (bVar2 != '\0')) {
          pcVar4 = "# ";
          if (flags.debug == '\0') {
            pcVar4 = "";
          }
          if ((char)uVar5 != '\0') {
            pcVar4 = "";
          }
          if (*(int *)(histevents->what + lVar6 + -0xc) == 0) {
            pcVar4 = "";
          }
          snprintf(local_138,0x100,"%sOn T:%u you %s",pcVar4,
                   (ulong)*(uint *)(histevents->what + lVar6 + -0x10),histevents->what + lVar6 + -8)
          ;
          lVar3 = (long)local_150.size;
          if (local_150.size <= local_150.icount) {
            local_150.size = local_150.size * 2;
            local_150.items = (nh_menuitem *)realloc(local_150.items,lVar3 * 0x218);
          }
          pnVar1 = local_150.items + local_150.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          local_150.icount = local_150.icount + 1;
          uVar5 = local_13c;
        }
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x108;
      } while (uVar8 < histcount);
    }
    display_menu(local_150.items,local_150.icount,"History has recorded:",0,(int *)0x0);
    free(local_150.items);
  }
  return 0;
}

Assistant:

int dohistory(void)
{
    struct menulist menu;
    boolean over = program_state.gameover;
    boolean showall = over || wizard;
    char buf[BUFSZ];
    int i;
    
    if (histcount < 2) {
	/* you get an automatic entry on turn 1 for being born.
	 * If it's the only one, there is nothing worth reporting */
	if (!over)
	    pline("History has not recorded anything about you.");
	return 0;
    }
    
    init_menulist(&menu);
    for (i = 0; i < histcount; i++) {
	if (histevents[i].hidden && !showall)
	    continue;
	snprintf(buf, BUFSZ, "%sOn T:%u you %s",
		 (histevents[i].hidden && !over && wizard) ? "# " : "",
		 histevents[i].when, histevents[i].what);
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "History has recorded:", PICK_NONE, NULL);
    free(menu.items);
    
    return 0;
}